

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O0

void __thiscall
pstore::serialize::archive::database_reader::get<pstore::uint128,void>
          (database_reader *this,uint128 *v)

{
  typed_address<pstore::uint128> addr;
  value_type v_00;
  unsigned_long distance;
  type puVar1;
  typed_address<pstore::uint128> local_40;
  undefined1 local_38 [8];
  unique_pointer<const_pstore::uint128> result;
  unsigned_long extra_for_alignment;
  uint128 *v_local;
  database_reader *this_local;
  
  v_00 = address::absolute(&this->addr_);
  distance = calc_alignment<unsigned_long>(v_00,0x10);
  if (distance < 0x10) {
    result._M_t.super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>._M_t
    .super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>.
    super__Head_base<0UL,_const_pstore::uint128_*,_false>._M_head_impl =
         (uint128 *)address::operator+=(&this->addr_,distance);
    addr.a_.a_ = (address)this->db_;
    typed_address<pstore::uint128>::typed_address(&local_40,(address)(this->addr_).a_);
    database::getrou<pstore::uint128,void>((database *)local_38,addr);
    address::operator+=(&this->addr_,0x10);
    puVar1 = std::unique_ptr<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>::operator*
                       ((unique_ptr<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)> *)
                        local_38);
    *(long *)&v->v_ = (long)puVar1->v_;
    *(undefined8 *)((long)&v->v_ + 8) = *(undefined8 *)((long)&puVar1->v_ + 8);
    std::unique_ptr<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>::~unique_ptr
              ((unique_ptr<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)> *)local_38);
    return;
  }
  assert_failed("extra_for_alignment < sizeof (Ty)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/db_archive.hpp"
                ,0x94);
}

Assistant:

void database_reader::get (Ty & v) {

                auto const extra_for_alignment = calc_alignment (addr_.absolute (), alignof (Ty));
                PSTORE_ASSERT (extra_for_alignment < sizeof (Ty));
                addr_ += extra_for_alignment;
                // Load the data.
                auto result = db_.getrou (typed_address<Ty> (addr_));
                addr_ += sizeof (Ty);
                // Copy to the destination.
                new (&v) Ty (*result);
            }